

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O0

void __thiscall AST::toDot(AST *this,string *filename)

{
  ASTree *this_00;
  string local_38;
  string *local_18;
  string *filename_local;
  AST *this_local;
  
  this_00 = this->ast;
  local_18 = filename;
  filename_local = (string *)this;
  std::__cxx11::string::string((string *)&local_38,(string *)filename);
  ASTree::toDot(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void AST::toDot(std::string filename) {
    return ast->toDot(filename);
}